

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

double primary(void)

{
  double dVar1;
  undefined8 uVar2;
  string *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  uint extraout_XMM0_Dd_02;
  uint extraout_XMM0_Dd_03;
  uint uVar4;
  uint extraout_XMM0_Dd_04;
  uint extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  Token prevToken;
  Token t;
  undefined1 auStack_e8 [16];
  string local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [48];
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  undefined1 local_38 [48];
  
  local_b8._8_8_ = local_b8._0_8_;
  this = (string *)auStack_e8;
  Token_stream::get((Token *)local_a8,&ts);
  if (local_a8[0] == 'a') {
    Token::Token((Token *)auStack_e8,(Token *)local_a8);
    Token_stream::get((Token *)local_78,&ts);
    Token::operator=((Token *)local_a8,(Token *)local_78);
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
    if (local_a8[0] == '=') {
      dVar1 = expression();
      Symbol_table::set_value(&st,(string *)(auStack_e8 + 0x10),dVar1);
    }
    else {
      Token::Token((Token *)local_38,(Token *)local_a8);
      Token_stream::unget(&ts,(Token *)local_38);
      std::__cxx11::string::~string((string *)(local_38 + 0x10));
    }
    dVar1 = Symbol_table::get_value(&st,(string *)(auStack_e8 + 0x10));
    local_b8._8_4_ = extraout_XMM0_Dc_06;
    local_b8._0_8_ = dVar1;
    local_b8._12_4_ = extraout_XMM0_Dd_06;
    this = (string *)(auStack_e8 + 0x10);
LAB_00104a7e:
    std::__cxx11::string::~string(this);
    goto LAB_00104a14;
  }
  if (local_a8[0] == '+') {
    local_a8._8_8_ = primary();
    uVar3 = extraout_XMM0_Dc_04;
    uVar4 = extraout_XMM0_Dd_04;
  }
  else if (local_a8[0] == '-') {
    local_a8._8_8_ = primary();
    local_a8._8_8_ = -(double)local_a8._8_8_;
    uVar4 = extraout_XMM0_Dd_03 ^ 0x80000000;
    uVar3 = extraout_XMM0_Dc_03;
  }
  else if (local_a8[0] == '8') {
    if (((double)local_a8._8_8_ < -2147483648.0) || (2147483647.0 < (double)local_a8._8_8_)) {
      compose_owerflow_err_msg_abi_cxx11_((string *)auStack_e8,(double)local_a8._8_8_);
      error((string *)auStack_e8);
LAB_001049f9:
      std::__cxx11::string::~string((string *)auStack_e8);
    }
    else if (((double)local_a8._8_8_ != (double)(int)(double)local_a8._8_8_) ||
            (NAN((double)local_a8._8_8_) || NAN((double)(int)(double)local_a8._8_8_))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"calculator can handle only integer input",
                 (allocator<char> *)local_78);
      error((string *)auStack_e8);
      goto LAB_001049f9;
    }
    uVar3 = 0;
    uVar4 = 0;
  }
  else if (local_a8[0] == 'N') {
    dVar1 = primary();
    local_a8._8_8_ = log(dVar1);
    uVar3 = extraout_XMM0_Dc_00;
    uVar4 = extraout_XMM0_Dd_00;
  }
  else if (local_a8[0] == 'P') {
    Token_stream::get((Token *)auStack_e8,&ts);
    Token::operator=((Token *)local_a8,(Token *)auStack_e8);
    std::__cxx11::string::~string((string *)(auStack_e8 + 0x10));
    if (local_a8[0] != '(') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"\'(\' expected after pow",(allocator<char> *)local_78);
      error((string *)auStack_e8);
      std::__cxx11::string::~string((string *)auStack_e8);
    }
    local_b8._0_8_ = expression();
    Token_stream::get((Token *)auStack_e8,&ts);
    Token::operator=((Token *)local_a8,(Token *)auStack_e8);
    std::__cxx11::string::~string((string *)(auStack_e8 + 0x10));
    if (local_a8[0] != ',') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"\',\' expected",(allocator<char> *)local_78);
      error((string *)auStack_e8);
      std::__cxx11::string::~string((string *)auStack_e8);
    }
    dVar1 = expression();
    local_48._8_4_ = extraout_XMM0_Dc_01;
    local_48._0_8_ = dVar1;
    local_48._12_4_ = extraout_XMM0_Dd_01;
    if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"exponent for pow function must be an iteger",
                 (allocator<char> *)local_78);
      error((string *)auStack_e8);
      std::__cxx11::string::~string((string *)auStack_e8);
    }
    Token_stream::get((Token *)auStack_e8,&ts);
    Token::operator=((Token *)local_a8,(Token *)auStack_e8);
    std::__cxx11::string::~string((string *)(auStack_e8 + 0x10));
    if (local_a8[0] != ')') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"\')\' expected",(allocator<char> *)local_78);
      error((string *)auStack_e8);
      std::__cxx11::string::~string((string *)auStack_e8);
    }
    local_a8._8_8_ = pow((double)local_b8._0_8_,(double)local_48._0_8_);
    uVar3 = extraout_XMM0_Dc_02;
    uVar4 = extraout_XMM0_Dd_02;
  }
  else {
    if (local_a8[0] != 'R') {
      if (local_a8[0] != '(') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_e8,"primary expected",(allocator<char> *)local_78);
        error((string *)auStack_e8);
        uVar2 = std::__cxx11::string::~string((string *)auStack_e8);
        std::__cxx11::string::~string((string *)auStack_e8);
        std::__cxx11::string::~string((string *)(local_a8 + 0x10));
        _Unwind_Resume(uVar2);
      }
      dVar1 = expression();
      local_b8._8_4_ = extraout_XMM0_Dc;
      local_b8._0_8_ = dVar1;
      local_b8._12_4_ = extraout_XMM0_Dd;
      Token_stream::get((Token *)auStack_e8,&ts);
      Token::operator=((Token *)local_a8,(Token *)auStack_e8);
      std::__cxx11::string::~string((string *)(auStack_e8 + 0x10));
      if (local_a8[0] == ')') goto LAB_00104a14;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"\'(\' expected",(allocator<char> *)local_78);
      error((string *)auStack_e8);
      goto LAB_00104a7e;
    }
    local_b8._0_8_ = expression();
    if ((double)local_b8._0_8_ < 0.0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_e8,"square root is defined for non negative numbers",
                 (allocator<char> *)local_78);
      error((string *)auStack_e8);
      std::__cxx11::string::~string((string *)auStack_e8);
    }
    uVar3 = 0;
    uVar4 = 0;
    if ((double)local_b8._0_8_ < 0.0) {
      local_a8._8_8_ = sqrt((double)local_b8._0_8_);
      uVar3 = extraout_XMM0_Dc_05;
      uVar4 = extraout_XMM0_Dd_05;
    }
    else {
      local_a8._8_8_ = SQRT((double)local_b8._0_8_);
    }
  }
  local_b8._8_4_ = uVar3;
  local_b8._0_8_ = local_a8._8_8_;
  local_b8._12_4_ = uVar4;
LAB_00104a14:
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  return (double)local_b8._0_8_;
}

Assistant:

double primary()
{
	Token t = ts.get();
	switch (t.kind)
	{
	case '(':
	{
		double d = expression();
		t = ts.get();
		if (t.kind != ')') error("'(' expected");
		return d;
	}
	case '-':
		return -primary();
	case '+':
		return primary();
	case number:
	{
		if (is_out_of_int32_range(t.value))
			error(compose_owerflow_err_msg(t.value));
		else if (static_cast<int32_t>(t.value) != t.value)
			error("calculator can handle only integer input");
		return t.value;
	}
	case square_root:
	{
		auto d = expression();
		if (d < 0)
			error("square root is defined for non negative numbers");
		return sqrt(d);
	}
	case power:
	{
		t = ts.get();
		if (t.kind != '(')
			error("'(' expected after pow");
		double base = expression();
		t = ts.get();
		if (t.kind != ',')
			error("',' expected");
		auto exponent = expression();
		if (static_cast<int32_t>(exponent) != exponent)
			error("exponent for pow function must be an iteger");
		t = ts.get();
		if (t.kind != ')')
			error("')' expected");
		return pow(base, exponent);
	}
	case name:
	{
		auto prevToken = t;
		t = ts.get();
		if (t.kind != '=')
		{
			ts.unget(t);
			return st.get_value(prevToken.name);
		}
		st.set_value(prevToken.name, expression());
		return st.get_value(prevToken.name);
	}
	case natural_log:
		return log(primary());
	default:
		error("primary expected");
	}
}